

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3EndTable(Parse *pParse,Token *pCons,Token *pEnd,u32 tabOpts,Select *pSelect)

{
  byte *pbVar1;
  u32 *puVar2;
  byte bVar3;
  ushort uVar4;
  i16 iVar5;
  Pgno PVar6;
  int iVar7;
  Table *pTab;
  sqlite3 *db;
  Column *pCVar8;
  undefined8 uVar9;
  Schema *pSVar10;
  ExprList *pEVar11;
  LogEst LVar12;
  int iVar13;
  int iVar14;
  Expr *pEVar15;
  void *pvVar16;
  Vdbe *p;
  Token *pTVar17;
  Parse *pPVar18;
  Table *pTable;
  int iVar19;
  uint uVar20;
  Schema **ppSVar21;
  char *pcVar22;
  Op *pOVar23;
  u8 *puVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  char *pcVar28;
  ulong uVar29;
  Index *pIdx;
  bool bVar30;
  Op *local_78;
  SelectDest dest;
  
  if (pEnd == (Token *)0x0 && pSelect == (Select *)0x0) {
    return;
  }
  pTab = pParse->pNewTable;
  if (pTab == (Table *)0x0) {
    return;
  }
  db = pParse->db;
  if ((pSelect == (Select *)0x0) && (iVar13 = sqlite3ShadowTableName(db,pTab->zName), iVar13 != 0))
  {
    pbVar1 = (byte *)((long)&pTab->tabFlags + 1);
    *pbVar1 = *pbVar1 | 0x10;
  }
  if ((db->init).busy != '\0') {
    if ((pSelect != (Select *)0x0) || ((pTab->eTabType != '\0' && ((db->init).newTnum != 0)))) {
      pcVar28 = "";
      goto LAB_0017293a;
    }
    PVar6 = (db->init).newTnum;
    pTab->tnum = PVar6;
    if (PVar6 == 1) {
      *(byte *)&pTab->tabFlags = (byte)pTab->tabFlags | 1;
    }
  }
  if (((tabOpts >> 0x10 & 1) != 0) &&
     (pbVar1 = (byte *)((long)&pTab->tabFlags + 2), *pbVar1 = *pbVar1 | 1, 0 < pTab->nCol)) {
    lVar25 = 0;
    uVar29 = 0;
    do {
      pCVar8 = pTab->aCol;
      bVar3 = (&pCVar8->field_0x8)[lVar25];
      if (bVar3 < 0x10) {
        pcVar28 = pTab->zName;
        uVar9 = *(undefined8 *)((long)&pCVar8->zCnName + lVar25);
        if ((*(byte *)((long)&pCVar8->colFlags + lVar25) & 4) == 0) {
          sqlite3ErrorMsg(pParse,"missing datatype for %s.%s",pcVar28,uVar9);
        }
        else {
          pcVar22 = sqlite3ColumnType((Column *)((long)&pCVar8->zCnName + lVar25),"");
          sqlite3ErrorMsg(pParse,"unknown datatype for %s.%s: \"%s\"",pcVar28,uVar9,pcVar22);
        }
      }
      else {
        if ((bVar3 & 0xf0) == 0x10) {
          (&pCVar8->affinity)[lVar25] = 'A';
        }
        if ((((*(byte *)((long)&pCVar8->colFlags + lVar25) & 1) != 0) &&
            (uVar29 != (uint)(int)pTab->iPKey)) && (((&pCVar8->field_0x8)[lVar25] & 0xf) == 0)) {
          (&pCVar8->field_0x8)[lVar25] = (&pCVar8->field_0x8)[lVar25] | 2;
          pbVar1 = (byte *)((long)&pTab->tabFlags + 1);
          *pbVar1 = *pbVar1 | 8;
        }
      }
      if (bVar3 < 0x10) {
        return;
      }
      uVar29 = uVar29 + 1;
      lVar25 = lVar25 + 0x10;
    } while ((long)uVar29 < (long)pTab->nCol);
  }
  if ((char)tabOpts < '\0') {
    uVar20 = pTab->tabFlags;
    if ((uVar20 & 8) != 0) {
      pcVar28 = "AUTOINCREMENT not allowed on WITHOUT ROWID tables";
      goto LAB_0017293a;
    }
    if ((uVar20 & 4) == 0) {
      sqlite3ErrorMsg(pParse,"PRIMARY KEY missing on table %s",pTab->zName);
      return;
    }
    pTab->tabFlags = uVar20 | 0x280;
    convertToWithoutRowidTable(pParse,pTab);
  }
  if (pTab->pSchema == (Schema *)0x0) {
    iVar13 = -0x8000;
  }
  else {
    iVar13 = -1;
    ppSVar21 = &db->aDb->pSchema;
    do {
      iVar13 = iVar13 + 1;
      pSVar10 = *ppSVar21;
      ppSVar21 = ppSVar21 + 4;
    } while (pSVar10 != pTab->pSchema);
  }
  if ((pTab->pCheck != (ExprList *)0x0) &&
     (sqlite3ResolveSelfReference(pParse,pTab,4,(Expr *)0x0,pTab->pCheck), pParse->nErr != 0)) {
    if (pTab->pCheck != (ExprList *)0x0) {
      exprListDeleteNN(db,pTab->pCheck);
    }
    pTab->pCheck = (ExprList *)0x0;
  }
  if ((pTab->tabFlags & 0x60) != 0) {
    if (0 < pTab->nCol) {
      lVar27 = 0;
      lVar25 = 0;
      iVar19 = 0;
      do {
        if ((*(byte *)((long)&pTab->aCol->colFlags + lVar27) & 0x60) == 0) {
          iVar19 = iVar19 + 1;
        }
        else {
          uVar4 = *(ushort *)((long)&pTab->aCol->iDflt + lVar27);
          if (((uVar4 == 0) || (pTab->eTabType != '\0')) ||
             ((pEVar11 = (pTab->u).tab.pDfltList, pEVar11 == (ExprList *)0x0 ||
              (pEVar11->nExpr < (int)(uint)uVar4)))) {
            pEVar15 = (Expr *)0x0;
          }
          else {
            pEVar15 = pEVar11->a[uVar4 - 1].pExpr;
          }
          iVar14 = sqlite3ResolveSelfReference(pParse,pTab,8,pEVar15,(ExprList *)0x0);
          if (iVar14 != 0) {
            pCVar8 = pTab->aCol;
            pEVar15 = (Expr *)sqlite3DbMallocRawNN(db,0x48);
            if (pEVar15 != (Expr *)0x0) {
              pEVar15->op = '\0';
              pEVar15->affExpr = '\0';
              pEVar15->op2 = '\0';
              pEVar15->field_0x3 = 0;
              pEVar15->flags = 0;
              (pEVar15->u).zToken = (char *)0x0;
              pEVar15->iColumn = 0;
              pEVar15->iAgg = 0;
              pEVar15->w = (anon_union_4_2_009eaf8f_for_w)0x0;
              pEVar15->pAggInfo = (AggInfo *)0x0;
              (pEVar15->x).pList = (ExprList *)0x0;
              pEVar15->nHeight = 0;
              pEVar15->iTable = 0;
              pEVar15->pLeft = (Expr *)0x0;
              pEVar15->pRight = (Expr *)0x0;
              (pEVar15->y).pTab = (Table *)0x0;
              pEVar15->op = 'y';
              pEVar15->iAgg = -1;
              pEVar15->nHeight = 1;
            }
            sqlite3ColumnSetExpr(pParse,pTab,(Column *)((long)&pCVar8->zCnName + lVar27),pEVar15);
          }
        }
        lVar25 = lVar25 + 1;
        lVar27 = lVar27 + 0x10;
      } while (lVar25 < pTab->nCol);
      if (iVar19 != 0) goto LAB_00172c10;
    }
    pcVar28 = "must have at least one non-generated column";
LAB_0017293a:
    sqlite3ErrorMsg(pParse,pcVar28);
    return;
  }
LAB_00172c10:
  if (pTab->nCol < 1) {
    iVar19 = 0;
  }
  else {
    iVar14 = pTab->nCol + 1;
    puVar24 = &pTab->aCol->szEst;
    iVar19 = 0;
    do {
      iVar19 = iVar19 + (uint)*puVar24;
      iVar14 = iVar14 + -1;
      puVar24 = puVar24 + 0x10;
    } while (1 < iVar14);
  }
  LVar12 = sqlite3LogEst((ulong)(((uint)((ushort)pTab->iPKey >> 0xf) + iVar19) * 4));
  pTab->szTabRow = LVar12;
  for (pIdx = pTab->pIndex; pIdx != (Index *)0x0; pIdx = pIdx->pNext) {
    estimateIndexWidth(pIdx);
  }
  if ((db->init).busy != '\0') goto LAB_00172c82;
  p = sqlite3GetVdbe(pParse);
  if (p == (Vdbe *)0x0) {
    return;
  }
  sqlite3VdbeAddOp3(p,0x7a,0,0,0);
  bVar30 = pTab->eTabType == '\0';
  pcVar28 = "VIEW";
  if (bVar30) {
    pcVar28 = "TABLE";
  }
  pcVar22 = "view";
  if (bVar30) {
    pcVar22 = "table";
  }
  if (pSelect == (Select *)0x0) {
    pTVar17 = &pParse->sLastToken;
    if (tabOpts == 0) {
      pTVar17 = pEnd;
    }
    uVar20 = (int)pTVar17->z - (int)(pParse->sNameToken).z;
    if (*pTVar17->z != ';') {
      uVar20 = uVar20 + pTVar17->n;
    }
    pcVar28 = sqlite3MPrintf(db,"CREATE %s %.*s",pcVar28,(ulong)uVar20);
  }
  else {
    if (pParse->eParseMode != '\0') {
      pParse->rc = 1;
      pParse->nErr = pParse->nErr + 1;
      return;
    }
    iVar19 = pParse->nMem;
    iVar26 = iVar19 + 1;
    iVar14 = iVar19 + 3;
    pParse->nMem = iVar14;
    pPVar18 = pParse->pToplevel;
    if (pParse->pToplevel == (Parse *)0x0) {
      pPVar18 = pParse;
    }
    pPVar18->mayAbort = '\x01';
    sqlite3VdbeAddOp3(p,0x71,1,pParse->regRoot,iVar13);
    iVar7 = p->nOp;
    lVar25 = (long)iVar7;
    if (0 < lVar25) {
      p->aOp[lVar25 + -1].p5 = 0x10;
    }
    pParse->nTab = 2;
    sqlite3VdbeAddOp3(p,0xb,iVar26,0,iVar7 + 1);
    if (pParse->nErr != 0) {
      return;
    }
    pTable = sqlite3ResultSetOfSelect(pParse,pSelect,'A');
    if (pTable == (Table *)0x0) {
      return;
    }
    iVar5 = pTable->nCol;
    pTab->nNVCol = iVar5;
    pTab->nCol = iVar5;
    pTab->aCol = pTable->aCol;
    pTable->nCol = 0;
    pTable->aCol = (Column *)0x0;
    if (db->pnBytesFreed == (int *)0x0) {
      puVar2 = &pTable->nTabRef;
      *puVar2 = *puVar2 - 1;
      if (*puVar2 == 0) goto LAB_00172fbf;
    }
    else {
LAB_00172fbf:
      deleteTable(db,pTable);
    }
    dest.eDest = '\r';
    dest.iSDParm2 = 0;
    dest.zAffSdst = (char *)0x0;
    dest.iSdst = 0;
    dest.nSdst = 0;
    dest.iSDParm = iVar26;
    sqlite3Select(pParse,pSelect,&dest);
    if (pParse->nErr != 0) {
      return;
    }
    sqlite3VdbeAddOp3(p,0x44,iVar26,0,0);
    pPVar18 = p->pParse;
    pPVar18->nTempReg = '\0';
    pPVar18->nRangeReg = 0;
    local_78 = (Op *)&sqlite3VdbeGetOp_dummy;
    pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
    if (p->db->mallocFailed == '\0') {
      pOVar23 = p->aOp + lVar25;
    }
    pOVar23->p2 = p->nOp;
    iVar26 = sqlite3VdbeAddOp3(p,0xc,dest.iSDParm,0,0);
    sqlite3VdbeAddOp3(p,0x61,dest.iSdst,dest.nSdst,iVar19 + 2);
    sqlite3TableAffinity(p,pTab,0);
    sqlite3VdbeAddOp3(p,0x7f,1,iVar14,0);
    sqlite3VdbeAddOp3(p,0x80,1,iVar19 + 2,iVar14);
    sqlite3VdbeAddOp3(p,9,0,iVar26,0);
    if (p->db->mallocFailed == '\0') {
      local_78 = p->aOp + iVar26;
    }
    local_78->p2 = p->nOp;
    sqlite3VdbeAddOp3(p,0x7a,1,0,0);
    pcVar28 = createTableStmt(db,pTab);
  }
  sqlite3NestedParse(pParse,
                     "UPDATE %Q.sqlite_master SET type=\'%s\', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q WHERE rowid=#%d"
                     ,db->aDb[iVar13].zDbSName,pcVar22,pTab->zName,pTab->zName,
                     (ulong)(uint)pParse->regRoot,pcVar28,(ulong)(uint)pParse->regRowid);
  if (pcVar28 != (char *)0x0) {
    sqlite3DbFreeNN(db,pcVar28);
  }
  sqlite3ChangeCookie(pParse,iVar13);
  if ((((pTab->tabFlags & 8) != 0) && (pParse->eParseMode == '\0')) &&
     ((db->aDb[iVar13].pSchema)->pSeqTab == (Table *)0x0)) {
    sqlite3NestedParse(pParse,"CREATE TABLE %Q.sqlite_sequence(name,seq)",db->aDb[iVar13].zDbSName);
  }
  pcVar28 = sqlite3MPrintf(db,"tbl_name=\'%q\' AND type!=\'trigger\'",pTab->zName);
  sqlite3VdbeAddParseSchemaOp(p,iVar13,pcVar28,0);
LAB_00172c82:
  if ((db->init).busy == '\0') {
    if (pSelect != (Select *)0x0) {
      return;
    }
  }
  else {
    pvVar16 = sqlite3HashInsert(&pTab->pSchema->tblHash,pTab->zName,pTab);
    if (pvVar16 == (void *)0x0) {
      pParse->pNewTable = (Table *)0x0;
      *(byte *)&db->mDbFlags = (byte)db->mDbFlags | 1;
      iVar13 = strcmp(pTab->zName,"sqlite_sequence");
      if (iVar13 == 0) {
        pTab->pSchema->pSeqTab = pTab;
      }
    }
    else {
      sqlite3OomFault(db);
    }
    if (pSelect != (Select *)0x0 || pvVar16 != (void *)0x0) {
      return;
    }
  }
  if (pTab->eTabType == '\0') {
    if (pCons->z != (char *)0x0) {
      pEnd = pCons;
    }
    (pTab->u).tab.addColOffset = (*(int *)&pEnd->z - *(int *)&(pParse->sNameToken).z) + 0xd;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3EndTable(
  Parse *pParse,          /* Parse context */
  Token *pCons,           /* The ',' token after the last column defn. */
  Token *pEnd,            /* The ')' before options in the CREATE TABLE */
  u32 tabOpts,            /* Extra table options. Usually 0. */
  Select *pSelect         /* Select from a "CREATE ... AS SELECT" */
){
  Table *p;                 /* The new table */
  sqlite3 *db = pParse->db; /* The database connection */
  int iDb;                  /* Database in which the table lives */
  Index *pIdx;              /* An implied index of the table */

  if( pEnd==0 && pSelect==0 ){
    return;
  }
  p = pParse->pNewTable;
  if( p==0 ) return;

  if( pSelect==0 && sqlite3ShadowTableName(db, p->zName) ){
    p->tabFlags |= TF_Shadow;
  }

  /* If the db->init.busy is 1 it means we are reading the SQL off the
  ** "sqlite_schema" or "sqlite_temp_schema" table on the disk.
  ** So do not write to the disk again.  Extract the root page number
  ** for the table from the db->init.newTnum field.  (The page number
  ** should have been put there by the sqliteOpenCb routine.)
  **
  ** If the root page number is 1, that means this is the sqlite_schema
  ** table itself.  So mark it read-only.
  */
  if( db->init.busy ){
    if( pSelect || (!IsOrdinaryTable(p) && db->init.newTnum) ){
      sqlite3ErrorMsg(pParse, "");
      return;
    }
    p->tnum = db->init.newTnum;
    if( p->tnum==1 ) p->tabFlags |= TF_Readonly;
  }

  /* Special processing for tables that include the STRICT keyword:
  **
  **   *  Do not allow custom column datatypes.  Every column must have
  **      a datatype that is one of INT, INTEGER, REAL, TEXT, or BLOB.
  **
  **   *  If a PRIMARY KEY is defined, other than the INTEGER PRIMARY KEY,
  **      then all columns of the PRIMARY KEY must have a NOT NULL
  **      constraint.
  */
  if( tabOpts & TF_Strict ){
    int ii;
    p->tabFlags |= TF_Strict;
    for(ii=0; ii<p->nCol; ii++){
      Column *pCol = &p->aCol[ii];
      if( pCol->eCType==COLTYPE_CUSTOM ){
        if( pCol->colFlags & COLFLAG_HASTYPE ){
          sqlite3ErrorMsg(pParse,
            "unknown datatype for %s.%s: \"%s\"",
            p->zName, pCol->zCnName, sqlite3ColumnType(pCol, "")
          );
        }else{
          sqlite3ErrorMsg(pParse, "missing datatype for %s.%s",
                          p->zName, pCol->zCnName);
        }
        return;
      }else if( pCol->eCType==COLTYPE_ANY ){
        pCol->affinity = SQLITE_AFF_BLOB;
      }
      if( (pCol->colFlags & COLFLAG_PRIMKEY)!=0
       && p->iPKey!=ii
       && pCol->notNull == OE_None
      ){
        pCol->notNull = OE_Abort;
        p->tabFlags |= TF_HasNotNull;
      }
    }
  }

  assert( (p->tabFlags & TF_HasPrimaryKey)==0
       || p->iPKey>=0 || sqlite3PrimaryKeyIndex(p)!=0 );
  assert( (p->tabFlags & TF_HasPrimaryKey)!=0
       || (p->iPKey<0 && sqlite3PrimaryKeyIndex(p)==0) );

  /* Special processing for WITHOUT ROWID Tables */
  if( tabOpts & TF_WithoutRowid ){
    if( (p->tabFlags & TF_Autoincrement) ){
      sqlite3ErrorMsg(pParse,
          "AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      return;
    }
    if( (p->tabFlags & TF_HasPrimaryKey)==0 ){
      sqlite3ErrorMsg(pParse, "PRIMARY KEY missing on table %s", p->zName);
      return;
    }
    p->tabFlags |= TF_WithoutRowid | TF_NoVisibleRowid;
    convertToWithoutRowidTable(pParse, p);
  }
  iDb = sqlite3SchemaToIndex(db, p->pSchema);

#ifndef SQLITE_OMIT_CHECK
  /* Resolve names in all CHECK constraint expressions.
  */
  if( p->pCheck ){
    sqlite3ResolveSelfReference(pParse, p, NC_IsCheck, 0, p->pCheck);
    if( pParse->nErr ){
      /* If errors are seen, delete the CHECK constraints now, else they might
      ** actually be used if PRAGMA writable_schema=ON is set. */
      sqlite3ExprListDelete(db, p->pCheck);
      p->pCheck = 0;
    }else{
      markExprListImmutable(p->pCheck);
    }
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
  if( p->tabFlags & TF_HasGenerated ){
    int ii, nNG = 0;
    testcase( p->tabFlags & TF_HasVirtual );
    testcase( p->tabFlags & TF_HasStored );
    for(ii=0; ii<p->nCol; ii++){
      u32 colFlags = p->aCol[ii].colFlags;
      if( (colFlags & COLFLAG_GENERATED)!=0 ){
        Expr *pX = sqlite3ColumnExpr(p, &p->aCol[ii]);
        testcase( colFlags & COLFLAG_VIRTUAL );
        testcase( colFlags & COLFLAG_STORED );
        if( sqlite3ResolveSelfReference(pParse, p, NC_GenCol, pX, 0) ){
          /* If there are errors in resolving the expression, change the
          ** expression to a NULL.  This prevents code generators that operate
          ** on the expression from inserting extra parts into the expression
          ** tree that have been allocated from lookaside memory, which is
          ** illegal in a schema and will lead to errors or heap corruption
          ** when the database connection closes. */
          sqlite3ColumnSetExpr(pParse, p, &p->aCol[ii],
               sqlite3ExprAlloc(db, TK_NULL, 0, 0));
        }
      }else{
        nNG++;
      }
    }
    if( nNG==0 ){
      sqlite3ErrorMsg(pParse, "must have at least one non-generated column");
      return;
    }
  }
#endif

  /* Estimate the average row size for the table and for all implied indices */
  estimateTableWidth(p);
  for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
    estimateIndexWidth(pIdx);
  }

  /* If not initializing, then create a record for the new table
  ** in the schema table of the database.
  **
  ** If this is a TEMPORARY table, write the entry into the auxiliary
  ** file instead of into the main database file.
  */
  if( !db->init.busy ){
    int n;
    Vdbe *v;
    char *zType;    /* "view" or "table" */
    char *zType2;   /* "VIEW" or "TABLE" */
    char *zStmt;    /* Text of the CREATE TABLE or CREATE VIEW statement */

    v = sqlite3GetVdbe(pParse);
    if( NEVER(v==0) ) return;

    sqlite3VdbeAddOp1(v, OP_Close, 0);

    /*
    ** Initialize zType for the new view or table.
    */
    if( IsOrdinaryTable(p) ){
      /* A regular table */
      zType = "table";
      zType2 = "TABLE";
#ifndef SQLITE_OMIT_VIEW
    }else{
      /* A view */
      zType = "view";
      zType2 = "VIEW";
#endif
    }

    /* If this is a CREATE TABLE xx AS SELECT ..., execute the SELECT
    ** statement to populate the new table. The root-page number for the
    ** new table is in register pParse->regRoot.
    **
    ** Once the SELECT has been coded by sqlite3Select(), it is in a
    ** suitable state to query for the column names and types to be used
    ** by the new table.
    **
    ** A shared-cache write-lock is not required to write to the new table,
    ** as a schema-lock must have already been obtained to create it. Since
    ** a schema-lock excludes all other database users, the write-lock would
    ** be redundant.
    */
    if( pSelect ){
      SelectDest dest;    /* Where the SELECT should store results */
      int regYield;       /* Register holding co-routine entry-point */
      int addrTop;        /* Top of the co-routine */
      int regRec;         /* A record to be insert into the new table */
      int regRowid;       /* Rowid of the next row to insert */
      int addrInsLoop;    /* Top of the loop for inserting rows */
      Table *pSelTab;     /* A table that describes the SELECT results */

      if( IN_SPECIAL_PARSE ){
        pParse->rc = SQLITE_ERROR;
        pParse->nErr++;
        return;
      }
      regYield = ++pParse->nMem;
      regRec = ++pParse->nMem;
      regRowid = ++pParse->nMem;
      assert(pParse->nTab==1);
      sqlite3MayAbort(pParse);
      sqlite3VdbeAddOp3(v, OP_OpenWrite, 1, pParse->regRoot, iDb);
      sqlite3VdbeChangeP5(v, OPFLAG_P2ISREG);
      pParse->nTab = 2;
      addrTop = sqlite3VdbeCurrentAddr(v) + 1;
      sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, addrTop);
      if( pParse->nErr ) return;
      pSelTab = sqlite3ResultSetOfSelect(pParse, pSelect, SQLITE_AFF_BLOB);
      if( pSelTab==0 ) return;
      assert( p->aCol==0 );
      p->nCol = p->nNVCol = pSelTab->nCol;
      p->aCol = pSelTab->aCol;
      pSelTab->nCol = 0;
      pSelTab->aCol = 0;
      sqlite3DeleteTable(db, pSelTab);
      sqlite3SelectDestInit(&dest, SRT_Coroutine, regYield);
      sqlite3Select(pParse, pSelect, &dest);
      if( pParse->nErr ) return;
      sqlite3VdbeEndCoroutine(v, regYield);
      sqlite3VdbeJumpHere(v, addrTop - 1);
      addrInsLoop = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, dest.iSdst, dest.nSdst, regRec);
      sqlite3TableAffinity(v, p, 0);
      sqlite3VdbeAddOp2(v, OP_NewRowid, 1, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, 1, regRec, regRowid);
      sqlite3VdbeGoto(v, addrInsLoop);
      sqlite3VdbeJumpHere(v, addrInsLoop);
      sqlite3VdbeAddOp1(v, OP_Close, 1);
    }

    /* Compute the complete text of the CREATE statement */
    if( pSelect ){
      zStmt = createTableStmt(db, p);
    }else{
      Token *pEnd2 = tabOpts ? &pParse->sLastToken : pEnd;
      n = (int)(pEnd2->z - pParse->sNameToken.z);
      if( pEnd2->z[0]!=';' ) n += pEnd2->n;
      zStmt = sqlite3MPrintf(db,
          "CREATE %s %.*s", zType2, n, pParse->sNameToken.z
      );
    }

    /* A slot for the record has already been allocated in the
    ** schema table.  We just need to update that slot with all
    ** the information we've collected.
    */
    sqlite3NestedParse(pParse,
      "UPDATE %Q." LEGACY_SCHEMA_TABLE
      " SET type='%s', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q"
      " WHERE rowid=#%d",
      db->aDb[iDb].zDbSName,
      zType,
      p->zName,
      p->zName,
      pParse->regRoot,
      zStmt,
      pParse->regRowid
    );
    sqlite3DbFree(db, zStmt);
    sqlite3ChangeCookie(pParse, iDb);

#ifndef SQLITE_OMIT_AUTOINCREMENT
    /* Check to see if we need to create an sqlite_sequence table for
    ** keeping track of autoincrement keys.
    */
    if( (p->tabFlags & TF_Autoincrement)!=0 && !IN_SPECIAL_PARSE ){
      Db *pDb = &db->aDb[iDb];
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      if( pDb->pSchema->pSeqTab==0 ){
        sqlite3NestedParse(pParse,
          "CREATE TABLE %Q.sqlite_sequence(name,seq)",
          pDb->zDbSName
        );
      }
    }
#endif

    /* Reparse everything to update our internal data structures */
    sqlite3VdbeAddParseSchemaOp(v, iDb,
           sqlite3MPrintf(db, "tbl_name='%q' AND type!='trigger'", p->zName),0);
  }

  /* Add the table to the in-memory representation of the database.
  */
  if( db->init.busy ){
    Table *pOld;
    Schema *pSchema = p->pSchema;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    assert( HasRowid(p) || p->iPKey<0 );
    pOld = sqlite3HashInsert(&pSchema->tblHash, p->zName, p);
    if( pOld ){
      assert( p==pOld );  /* Malloc must have failed inside HashInsert() */
      sqlite3OomFault(db);
      return;
    }
    pParse->pNewTable = 0;
    db->mDbFlags |= DBFLAG_SchemaChange;

    /* If this is the magic sqlite_sequence table used by autoincrement,
    ** then record a pointer to this table in the main database structure
    ** so that INSERT can find the table easily.  */
    assert( !pParse->nested );
#ifndef SQLITE_OMIT_AUTOINCREMENT
    if( strcmp(p->zName, "sqlite_sequence")==0 ){
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      p->pSchema->pSeqTab = p;
    }
#endif
  }

#ifndef SQLITE_OMIT_ALTERTABLE
  if( !pSelect && IsOrdinaryTable(p) ){
    assert( pCons && pEnd );
    if( pCons->z==0 ){
      pCons = pEnd;
    }
    p->u.tab.addColOffset = 13 + (int)(pCons->z - pParse->sNameToken.z);
  }
#endif
}